

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformEdgeSampleCollection.h
# Opt level: O1

OrderedEdgeCollection *
GetEdgesByUniSampling(OrderedEdgeCollection *__return_storage_ptr__,CGraph *cg,long params)

{
  size_type __n;
  size_type __n_00;
  long lVar1;
  EdgeIdx *pEVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  uniform_int_distribution<long> unif_rand_edge;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_e8;
  vector<bool,_std::allocator<bool>_> local_c8;
  vector<bool,_std::allocator<bool>_> local_a0;
  OrderedEdge local_78;
  OrderedEdgeCollection *local_58;
  ulong local_50;
  size_type local_48;
  uniform_int_distribution<long> local_40;
  
  __n = cg->nVertices;
  __n_00 = cg->nEdges;
  lVar1 = *(long *)(params + 0x40);
  local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (OrderedEdge *)0x0;
  local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (OrderedEdge *)0x0;
  local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_a0,__n_00,(bool *)&local_c8,(allocator_type *)&local_78);
  local_78.u = local_78.u & 0xffffffffffffff00;
  local_48 = __n;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_c8,__n,(bool *)&local_78,(allocator_type *)&local_40);
  local_40._M_param._M_b = __n_00 - 1;
  local_40._M_param._M_a = 0;
  if (lVar1 < 1) {
    lVar8 = 0;
  }
  else {
    lVar9 = 0;
    local_50 = 0x800000000000003f;
    local_58 = __return_storage_ptr__;
    do {
      uVar3 = std::uniform_int_distribution<long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&stack0x00000008,&local_40._M_param);
      pEVar2 = cg->offsets;
      uVar5 = local_48;
      while (0 < (long)uVar5) {
        uVar6 = uVar5 >> 1;
        uVar7 = ~uVar6 + uVar5;
        uVar5 = uVar6;
        if ((pEVar2 + uVar6 + 1)[-1] <= (long)uVar3) {
          pEVar2 = pEVar2 + uVar6 + 1;
          uVar5 = uVar7;
        }
      }
      uVar6 = cg->nbors[uVar3];
      lVar8 = (long)pEVar2 - (long)cg->offsets >> 3;
      uVar5 = lVar8 - 1;
      uVar7 = Escape::CGraph::getEdgeBinary(cg,uVar5,uVar6);
      if (uVar7 != uVar3) {
        puts("Bug in the code!! Run!!!! \n");
      }
      pEVar2 = cg->offsets;
      local_78.degree = pEVar2[uVar6 + 1] - pEVar2[uVar6];
      lVar4 = pEVar2[lVar8] - pEVar2[lVar8 + -1];
      local_78.u = uVar6;
      local_78.v = uVar5;
      if ((lVar4 <= local_78.degree) && ((local_78.degree != lVar4 || ((long)uVar5 <= (long)uVar6)))
         ) {
        local_78.degree = lVar4;
        local_78.u = uVar5;
        local_78.v = uVar6;
      }
      local_78.index = uVar3;
      if (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_78);
      }
      else {
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->index = uVar3;
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->degree = local_78.degree;
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->u = local_78.u;
        (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
         super__Vector_impl_data._M_finish)->v = local_78.v;
        local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar9 = lVar9 + 1;
      uVar7 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar7 = uVar3;
      }
      local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar7 >> 6) + ((ulong)((uVar3 & local_50) < 0x8000000000000001) - 1)] =
           local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar7 >> 6) + ((ulong)((uVar3 & local_50) < 0x8000000000000001) - 1)] |
           1L << ((byte)uVar3 & 0x3f);
      uVar3 = lVar8 + 0x3e;
      if (-1 < (long)uVar5) {
        uVar3 = uVar5;
      }
      local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar3 >> 6) + ((ulong)((uVar5 & local_50) < 0x8000000000000001) - 1)] =
           local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar3 >> 6) + ((ulong)((uVar5 & local_50) < 0x8000000000000001) - 1)] |
           1L << ((byte)uVar5 & 0x3f);
      uVar5 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar5 = uVar6;
      }
      local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p
      [((long)uVar5 >> 6) + ((ulong)((uVar6 & local_50) < 0x8000000000000001) - 1)] =
           local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar5 >> 6) + ((ulong)((uVar6 & local_50) < 0x8000000000000001) - 1)] |
           1L << ((byte)uVar6 & 0x3f);
      lVar8 = lVar1;
      __return_storage_ptr__ = local_58;
    } while (lVar9 != lVar1);
  }
  __return_storage_ptr__->no_of_edges = lVar1;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (&__return_storage_ptr__->edge_list,&local_e8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_edge_set,&local_a0);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&__return_storage_ptr__->visited_vertex_set,&local_c8);
  __return_storage_ptr__->no_of_query = lVar8;
  if (local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_a0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

OrderedEdgeCollection GetEdgesByUniSampling(CGraph *cg, const Parameters &params, std::mt19937 mt) {
    /**
      * Setting of various input parameters for executing the algorithm
    */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count;
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and local variables
    */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool> visited_edge_set (m,false);
    std::vector<bool> visited_vertex_set (n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    VertexIdx src = 0, dst = 0;
    EdgeIdx nEdges = 0;
    /**
       * Set up random number generator
    */
    std::uniform_int_distribution<EdgeIdx> unif_rand_edge(0, m - 1);

    /**
     * Sample uniform random edges and store them in the structure
     */
    for (EdgeIdx i = 0; i < walk_length ; i++) {
        EdgeIdx e = unif_rand_edge(mt);
        dst = cg->nbors[e];
        no_of_query++; // One query to the uniform random neighbor oracle
        // binary search the array cg->offset to find the index v, such that edges[e] lies between cg->offset[v]
        // and cg->offset[v+1]. We achieve this by calling std::upper_bound
        src = std::upper_bound (cg->offsets, cg->offsets+n, e) - cg->offsets -1;

        // sanity check: the edge {src,dst} must have index edges[e].
        if (cg->getEdgeBinary(src,dst) != e)
            printf("Bug in the code!! Run!!!! \n\n");

        /**
          * Update the edge collection data structure with relevant information about the edge
         */
        VertexIdx u, v, low_deg;
        if (cg->degree(dst) < cg->degree(src) || (cg->degree(dst) == cg->degree(src) && dst < src)) {
            u = dst;
            v = src;
            low_deg = cg->degree(dst);
        } else {
            u = src;
            v = dst;
            low_deg = cg->degree(src);
        }
        edge_list.push_back(OrderedEdge{u, v, e, low_deg});

        /**
         * Update the book-keeping data structure with the visited edge and vertices
         */
        visited_edge_set[e] = true;
        visited_vertex_set[src] = true;
        visited_vertex_set[dst] = true;
    }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set, no_of_query};
    return returnEdgeCollection;
}